

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O1

int __thiscall
DirectionalScannerO1::nextOnRight
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pPVar5;
  bool *pbVar6;
  int iVar7;
  bool *pbVar8;
  int y;
  Pt2i PStack_38;
  
  if (((this->super_DirectionalScanner).clearance == true) &&
     (pPVar5 = (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
     _M_finish != pPVar5)) {
    (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pPVar5;
  }
  bVar2 = this->rstop;
  iVar7 = (this->super_DirectionalScanner).rcx;
  (this->super_DirectionalScanner).rcx = iVar7 + 1;
  if (bVar2 == true) {
    this->rstop = false;
  }
  else {
    pbVar8 = this->rst1;
    if (*pbVar8 == true) {
      pbVar6 = (this->super_DirectionalScanner).rst2;
      if (*pbVar6 == true) {
        (this->super_DirectionalScanner).rcx = iVar7;
        this->rstop = true;
      }
      piVar1 = &(this->super_DirectionalScanner).rcy;
      *piVar1 = *piVar1 + 1;
      pbVar6 = pbVar6 + 1;
      (this->super_DirectionalScanner).rst2 = pbVar6;
      if ((this->super_DirectionalScanner).fs <= pbVar6) {
        (this->super_DirectionalScanner).rst2 = (this->super_DirectionalScanner).steps;
      }
    }
    pbVar8 = pbVar8 + 1;
    this->rst1 = pbVar8;
    if ((this->super_DirectionalScanner).fs <= pbVar8) {
      this->rst1 = (this->super_DirectionalScanner).steps;
    }
  }
  iVar7 = (this->super_DirectionalScanner).rcx;
  y = (this->super_DirectionalScanner).rcy;
  pbVar8 = (this->super_DirectionalScanner).rst2;
  iVar3 = (this->super_DirectionalScanner).ymin;
  iVar4 = (this->super_DirectionalScanner).xmax;
  if (y < iVar3 || iVar4 <= iVar7) {
    do {
      if ((this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * iVar7 <
          (this->super_DirectionalScanner).dlc2) break;
      y = y + 1;
      iVar7 = iVar7 - (uint)*pbVar8;
      pbVar8 = pbVar8 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar8) {
        pbVar8 = (this->super_DirectionalScanner).steps;
      }
    } while (y < iVar3 || iVar4 <= iVar7);
  }
  if ((((this->super_DirectionalScanner).dlc2 <=
        (this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * iVar7) &&
      ((this->super_DirectionalScanner).xmin <= iVar7)) &&
     (y < (this->super_DirectionalScanner).ymax)) {
    do {
      Pt2i::Pt2i(&PStack_38,iVar7,y);
      std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
      pbVar6 = pbVar8 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar6) {
        pbVar6 = (this->super_DirectionalScanner).steps;
      }
      iVar7 = iVar7 - (uint)*pbVar8;
      y = y + 1;
    } while ((((this->super_DirectionalScanner).dlc2 <=
               (this->super_DirectionalScanner).dlb * y +
               (this->super_DirectionalScanner).dla * iVar7) &&
             ((this->super_DirectionalScanner).xmin <= iVar7)) &&
            (pbVar8 = pbVar6, y < (this->super_DirectionalScanner).ymax));
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::nextOnRight (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (rstop)
  {
    rcx ++;
    rstop = false;
  }
  else
  {
    rcx ++;
    if (*rst1)
    {
      if (*rst2)
      {
        rcx --;
        rstop = true;
      }
      rcy ++;
      if (++rst2 >= fs) rst2 = steps;
    }
    if (++rst1 >= fs) rst1 = steps;
  }

  // Computes the next scan
  int x = rcx;
  int y = rcy;
  bool *nst = rst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}